

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::InitResourceLayout
          (PipelineStateGLImpl *this,PSO_CREATE_INTERNAL_FLAGS InternalFlags,
          TShaderStages *ShaderStages,SHADER_TYPE ActiveStages)

{
  char *ShaderName;
  undefined4 ShaderStages_00;
  bool bVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  PSO_CREATE_INTERNAL_FLAGS PVar3;
  LinkStatus LVar4;
  PipelineResourceSignatureDesc *SignDesc_00;
  DeviceContextGLImpl *this_00;
  Char *pCVar5;
  GLContextState *State;
  ShaderGLImpl *pSVar6;
  const_reference ppSVar7;
  shared_ptr<const_Diligent::ShaderResourcesGL> *psVar8;
  element_type *peVar9;
  ShaderDesc *pSVar10;
  PipelineResourceSignatureGLImpl *pPVar11;
  RenderDeviceGLImpl *this_01;
  reference pvVar12;
  undefined4 in_register_0000000c;
  char (*Args_1) [25];
  GLContextState *Args_1_00;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  GLDeviceLimits *local_228;
  GLDeviceLimits *Limits;
  RefCntAutoPtr *pRStack_218;
  Uint32 p;
  SignatureAutoPtrType *pSignature;
  TBindings TStack_208;
  Uint32 s;
  TBindings Bindings;
  undefined1 local_1e8 [7];
  PIPELINE_RESOURCE_FLAGS SamplerResFlag;
  shared_ptr<const_Diligent::ShaderResourcesGL> pResources_1;
  string msg_2;
  shared_ptr<const_Diligent::ShaderResourcesGL> local_1a8;
  undefined1 local_198 [8];
  shared_ptr<const_Diligent::ShaderResourcesGL> pResources;
  ShaderGLImpl *pShaderGL;
  size_t i;
  GLContextState *CtxState;
  string msg_1;
  DeviceContextGLImpl *pImmediateCtx;
  string msg;
  char local_109;
  undefined1 local_108 [7];
  bool bIsDeviceInternal;
  PipelineResourceSignatureDescWrapper SignDesc;
  SHADER_TYPE ActiveStages_local;
  TShaderStages *ShaderStages_local;
  PSO_CREATE_INTERNAL_FLAGS InternalFlags_local;
  PipelineStateGLImpl *this_local;
  
  Args_1 = (char (*) [25])CONCAT44(in_register_0000000c,ActiveStages);
  SignDesc.m_Desc._52_4_ = ActiveStages;
  if (((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_UsingImplicitSignature & 1U)
      != 0) {
    PVar3 = Diligent::operator&(InternalFlags,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
    if (PVar3 != PSO_CREATE_INTERNAL_FLAG_NONE) {
      RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::Release
                ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures);
    }
    GetDefaultSignatureDesc
              ((PipelineResourceSignatureDescWrapper *)local_108,this,ShaderStages,
               SignDesc.m_Desc._52_4_);
    local_109 = '\x01';
    SignDesc_00 = PipelineResourceSignatureDescWrapper::
                  operator_cast_to_PipelineResourceSignatureDesc_
                            ((PipelineResourceSignatureDescWrapper *)local_108);
    msg.field_2._8_4_ =
         PipelineStateBase<Diligent::EngineGLImplTraits>::GetActiveShaderStages
                   (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    Args_1 = (char (*) [25])&local_109;
    PipelineStateBase<Diligent::EngineGLImplTraits>::
    InitDefaultSignature<Diligent::SHADER_TYPE,bool>
              (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,SignDesc_00,
               (SHADER_TYPE *)(msg.field_2._M_local_buf + 8),(bool *)Args_1);
    bVar1 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator!
                      ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures);
    if (bVar1) {
      FormatString<char[26],char[16]>
                ((string *)&pImmediateCtx,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_Signatures[0]",(char (*) [16])Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (char (*) [25])0xbf;
      DebugAssertionFailed
                (pCVar5,"InitResourceLayout",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0xbf);
      std::__cxx11::string::~string((string *)&pImmediateCtx);
    }
    PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
              ((PipelineResourceSignatureDescWrapper *)local_108);
  }
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg_1.field_2 + 8),
             (size_t)(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                     .m_pDevice);
  this_00 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextGLImpl_
                      ((RefCntAutoPtr *)(msg_1.field_2._M_local_buf + 8));
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_1.field_2 + 8));
  if (this_00 == (DeviceContextGLImpl *)0x0) {
    FormatString<char[26],char[25]>
              ((string *)&CtxState,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImmediateCtx != nullptr",Args_1);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)&CtxState);
  }
  State = DeviceContextGLImpl::GetContextState(this_00);
  if ((this->m_IsProgramPipelineSupported & 1U) != 0) {
    for (pShaderGL = (ShaderGLImpl *)0x0;
        pSVar6 = (ShaderGLImpl *)
                 std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::
                 size(ShaderStages), pShaderGL < pSVar6;
        pShaderGL = (ShaderGLImpl *)
                    ((long)&(pShaderGL->super_ShaderBase<Diligent::EngineGLImplTraits>).
                            super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                            .super_ObjectBase<Diligent::IShaderGL>.
                            super_RefCountedObject<Diligent::IShaderGL>.super_IShaderGL.
                            super_IShader.super_IDeviceObject + 1)) {
      ppSVar7 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::
                operator[](ShaderStages,(size_type)pShaderGL);
      pResources.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppSVar7;
      psVar8 = ShaderGLImpl::GetShaderResources
                         ((ShaderGLImpl *)
                          pResources.
                          super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      std::shared_ptr<const_Diligent::ShaderResourcesGL>::shared_ptr
                ((shared_ptr<const_Diligent::ShaderResourcesGL> *)local_198,psVar8);
      peVar9 = std::
               __shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(this->m_GLPrograms + (long)pShaderGL));
      std::shared_ptr<const_Diligent::ShaderResourcesGL>::shared_ptr
                (&local_1a8,(shared_ptr<const_Diligent::ShaderResourcesGL> *)local_198);
      GLProgram::SetResources(peVar9,&local_1a8);
      std::shared_ptr<const_Diligent::ShaderResourcesGL>::~shared_ptr(&local_1a8);
      std::shared_ptr<const_Diligent::ShaderResourcesGL>::shared_ptr
                ((shared_ptr<const_Diligent::ShaderResourcesGL> *)((long)&msg_2.field_2 + 8),
                 (shared_ptr<const_Diligent::ShaderResourcesGL> *)local_198);
      pSVar10 = DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                ::GetDesc((DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                           *)pResources.
                             super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      ShaderName = (pSVar10->super_DeviceObjectAttribs).Name;
      pSVar10 = DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                ::GetDesc((DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                           *)pResources.
                             super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      ValidateShaderResources
                (this,(shared_ptr<const_Diligent::ShaderResourcesGL> *)((long)&msg_2.field_2 + 8),
                 ShaderName,pSVar10->ShaderType);
      std::shared_ptr<const_Diligent::ShaderResourcesGL>::~shared_ptr
                ((shared_ptr<const_Diligent::ShaderResourcesGL> *)((long)&msg_2.field_2 + 8));
      std::shared_ptr<const_Diligent::ShaderResourcesGL>::~shared_ptr
                ((shared_ptr<const_Diligent::ShaderResourcesGL> *)local_198);
    }
    goto LAB_001dc33b;
  }
  Args_1_00 = State;
  bVar1 = std::operator!=(this->m_GLPrograms,(nullptr_t)0x0);
  if (bVar1) {
    peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->m_GLPrograms);
    LVar4 = GLProgram::GetLinkStatus(peVar9,false);
    if (LVar4 != Succeeded) goto LAB_001dc136;
  }
  else {
LAB_001dc136:
    FormatString<char[26],char[99]>
              ((string *)
               &pResources_1.
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded"
               ,(char (*) [99])Args_1_00);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xd2);
    std::__cxx11::string::~string
              ((string *)
               &pResources_1.
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->m_GLPrograms);
  psVar8 = GLProgram::GetResources(peVar9);
  std::shared_ptr<const_Diligent::ShaderResourcesGL>::shared_ptr
            ((shared_ptr<const_Diligent::ShaderResourcesGL> *)local_1e8,psVar8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e8);
  if (!bVar1) {
    PVar2 = GetSamplerResourceFlag(this,ShaderStages,false);
    peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->m_GLPrograms);
    ShaderStages_00 = SignDesc.m_Desc._52_4_;
    PVar2 = GetSamplerResourceFlag(this,ShaderStages,PVar2 != PIPELINE_RESOURCE_FLAG_NONE);
    psVar8 = GLProgram::LoadResources
                       (peVar9,ShaderStages_00,PVar2,State,false,SHADER_SOURCE_LANGUAGE_DEFAULT);
    std::shared_ptr<const_Diligent::ShaderResourcesGL>::operator=
              ((shared_ptr<const_Diligent::ShaderResourcesGL> *)local_1e8,psVar8);
  }
  std::shared_ptr<const_Diligent::ShaderResourcesGL>::shared_ptr
            ((shared_ptr<const_Diligent::ShaderResourcesGL> *)&Bindings,
             (shared_ptr<const_Diligent::ShaderResourcesGL> *)local_1e8);
  ValidateShaderResources
            (this,(shared_ptr<const_Diligent::ShaderResourcesGL> *)&Bindings,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,SignDesc.m_Desc._52_4_);
  std::shared_ptr<const_Diligent::ShaderResourcesGL>::~shared_ptr
            ((shared_ptr<const_Diligent::ShaderResourcesGL> *)&Bindings);
  std::shared_ptr<const_Diligent::ShaderResourcesGL>::~shared_ptr
            ((shared_ptr<const_Diligent::ShaderResourcesGL> *)local_1e8);
LAB_001dc33b:
  memset(&stack0xfffffffffffffdf8,0,8);
  for (pSignature._4_4_ = 0;
      pSignature._4_4_ <
      (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount;
      pSignature._4_4_ = pSignature._4_4_ + 1) {
    pRStack_218 = (RefCntAutoPtr *)
                  ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures +
                  pSignature._4_4_);
    pPVar11 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureGLImpl_
                        (pRStack_218);
    if (pPVar11 != (PipelineResourceSignatureGLImpl *)0x0) {
      *&this->m_BaseBindings[pSignature._4_4_]._M_elems = TStack_208._M_elems;
      for (Limits._4_4_ = 0; Limits._4_4_ < this->m_NumPrograms; Limits._4_4_ = Limits._4_4_ + 1) {
        peVar9 = std::
                 __shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(this->m_GLPrograms + Limits._4_4_));
        pPVar11 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureGLImpl_
                            (pRStack_218);
        GLProgram::ApplyBindings(peVar9,pPVar11,State,&stack0xfffffffffffffdf8);
      }
      pPVar11 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->
                          ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)pRStack_218);
      PipelineResourceSignatureGLImpl::ShiftBindings(pPVar11,&stack0xfffffffffffffdf8);
    }
  }
  this_01 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)this);
  local_228 = RenderDeviceGLImpl::GetDeviceLimits(this_01);
  pvVar12 = std::array<unsigned_short,_4UL>::operator[](&stack0xfffffffffffffdf8,0);
  if ((uint)local_228->MaxUniformBlocks < (uint)*pvVar12) {
    local_230 = GetBindingRangeName(BINDING_RANGE_UNIFORM_BUFFER);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xf8,(char (*) [34])"The number of bindings in range \'",&local_230,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &local_228->MaxUniformBlocks,(char (*) [3])0x490759);
  }
  pvVar12 = std::array<unsigned_short,_4UL>::operator[](&stack0xfffffffffffffdf8,1);
  if ((uint)local_228->MaxTextureUnits < (uint)*pvVar12) {
    local_238 = GetBindingRangeName(BINDING_RANGE_TEXTURE);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfa,(char (*) [34])"The number of bindings in range \'",&local_238,
               (char (*) [40])"\' is greater than the maximum allowed (",&local_228->MaxTextureUnits
               ,(char (*) [3])0x490759);
  }
  pvVar12 = std::array<unsigned_short,_4UL>::operator[](&stack0xfffffffffffffdf8,3);
  if ((uint)local_228->MaxStorageBlock < (uint)*pvVar12) {
    local_240 = GetBindingRangeName(BINDING_RANGE_STORAGE_BUFFER);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfc,(char (*) [34])"The number of bindings in range \'",&local_240,
               (char (*) [40])"\' is greater than the maximum allowed (",&local_228->MaxStorageBlock
               ,(char (*) [3])0x490759);
  }
  pvVar12 = std::array<unsigned_short,_4UL>::operator[](&stack0xfffffffffffffdf8,2);
  if ((uint)local_228->MaxImagesUnits < (uint)*pvVar12) {
    local_248 = GetBindingRangeName(BINDING_RANGE_IMAGE);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfe,(char (*) [34])"The number of bindings in range \'",&local_248,
               (char (*) [40])"\' is greater than the maximum allowed (",&local_228->MaxImagesUnits,
               (char (*) [3])0x490759);
  }
  return;
}

Assistant:

void PipelineStateGLImpl::InitResourceLayout(PSO_CREATE_INTERNAL_FLAGS InternalFlags,
                                             const TShaderStages&      ShaderStages,
                                             SHADER_TYPE               ActiveStages)
{
    if (m_UsingImplicitSignature)
    {
        if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0)
        {
            // Release deserialized default signature as it is empty in OpenGL.
            // We need to create a new one from scratch.
            m_Signatures[0].Release();
        }

        const auto SignDesc = GetDefaultSignatureDesc(ShaderStages, ActiveStages);
        // Always initialize default resource signature as internal device object.
        // This is necessary to avoid cyclic references from TexRegionRenderer.
        // This may never be a problem as the PSO keeps the reference to the device if necessary.
        constexpr bool bIsDeviceInternal = true;
        InitDefaultSignature(SignDesc, GetActiveShaderStages(), bIsDeviceInternal);
        VERIFY_EXPR(m_Signatures[0]);
    }

    DeviceContextGLImpl* pImmediateCtx = m_pDevice->GetImmediateContext(0);
    VERIFY_EXPR(pImmediateCtx != nullptr);
    auto& CtxState = pImmediateCtx->GetContextState();

    if (m_IsProgramPipelineSupported)
    {
        for (size_t i = 0; i < ShaderStages.size(); ++i)
        {
            const ShaderGLImpl*                      pShaderGL  = ShaderStages[i];
            std::shared_ptr<const ShaderResourcesGL> pResources = pShaderGL->GetShaderResources();
            m_GLPrograms[i]->SetResources(pResources);
            ValidateShaderResources(std::move(pResources), pShaderGL->GetDesc().Name, pShaderGL->GetDesc().ShaderType);
        }
    }
    else
    {
        VERIFY_EXPR(m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded);

        std::shared_ptr<const ShaderResourcesGL> pResources = m_GLPrograms[0]->GetResources();
        if (!pResources)
        {
            // If resources are not loaded yet for this program, load them now
            const auto SamplerResFlag = GetSamplerResourceFlag(ShaderStages, false /*SilenceWarning*/);

            pResources = m_GLPrograms[0]->LoadResources(
                ActiveStages,
                GetSamplerResourceFlag(ShaderStages, SamplerResFlag),
                CtxState);
        }
        ValidateShaderResources(std::move(pResources), m_Desc.Name, ActiveStages);
    }

    // Apply resource bindings to programs.
    PipelineResourceSignatureGLImpl::TBindings Bindings = {};
    for (Uint32 s = 0; s < m_SignatureCount; ++s)
    {
        const auto& pSignature = m_Signatures[s];
        if (pSignature == nullptr)
            continue;

        m_BaseBindings[s] = Bindings;
        for (Uint32 p = 0; p < m_NumPrograms; ++p)
        {
            // GL programs are keyed by shader IDs and resource signature IDs or resource layout.
            // Consequently, any pipeline that uses a cached program will assign the same bindings.
            m_GLPrograms[p]->ApplyBindings(pSignature, CtxState, Bindings);
        }

        pSignature->ShiftBindings(Bindings);
    }

    const auto& Limits = GetDevice()->GetDeviceLimits();

    if (Bindings[BINDING_RANGE_UNIFORM_BUFFER] > static_cast<Uint32>(Limits.MaxUniformBlocks))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_UNIFORM_BUFFER), "' is greater than the maximum allowed (", Limits.MaxUniformBlocks, ").");
    if (Bindings[BINDING_RANGE_TEXTURE] > static_cast<Uint32>(Limits.MaxTextureUnits))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_TEXTURE), "' is greater than the maximum allowed (", Limits.MaxTextureUnits, ").");
    if (Bindings[BINDING_RANGE_STORAGE_BUFFER] > static_cast<Uint32>(Limits.MaxStorageBlock))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_STORAGE_BUFFER), "' is greater than the maximum allowed (", Limits.MaxStorageBlock, ").");
    if (Bindings[BINDING_RANGE_IMAGE] > static_cast<Uint32>(Limits.MaxImagesUnits))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_IMAGE), "' is greater than the maximum allowed (", Limits.MaxImagesUnits, ").");
}